

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O3

void __thiscall CVmObjLookupTable::mark_refs(CVmObjLookupTable *this,uint state)

{
  ulong uVar1;
  int *piVar2;
  uint *puVar3;
  
  puVar3 = (uint *)(this->super_CVmObjCollection).super_CVmObject.ext_;
  if (puVar3[4] == 5) {
    CVmObjTable::add_to_gc_queue(&G_obj_table_X,puVar3[6],state);
  }
  uVar1 = (ulong)*puVar3;
  if (uVar1 != 0) {
    puVar3 = puVar3 + 8;
    do {
      for (piVar2 = *(int **)puVar3; piVar2 != (int *)0x0; piVar2 = *(int **)(piVar2 + 8)) {
        if (*piVar2 == 5) {
          CVmObjTable::add_to_gc_queue(&G_obj_table_X,piVar2[2],state);
        }
        if (piVar2[4] == 5) {
          CVmObjTable::add_to_gc_queue(&G_obj_table_X,piVar2[6],state);
        }
      }
      puVar3 = puVar3 + 2;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  return;
}

Assistant:

void CVmObjLookupTable::mark_refs(VMG_ uint state)
{
    /* get my extension */
    vm_lookup_ext *ext = get_ext();

    /* mark the default value */
    const vm_val_t *val = &ext->default_value;
    if (val->typ == VM_OBJ)
        G_obj_table->mark_all_refs(val->val.obj, state);

    /* run through my buckets */
    vm_lookup_val **bp = ext->buckets;
    size_t i = ext->bucket_cnt;
    for ( ; i != 0 ; ++bp, --i)
    {
        /* run through all entries attached to this bucket */
        for (const vm_lookup_val *entry = *bp ; entry != 0 ;
             entry = entry->nxt)
        {
            /* if the key is an object, mark it as referenced */
            val = &entry->key;
            if  (val->typ == VM_OBJ)
                G_obj_table->mark_all_refs(val->val.obj, state);

            /* if the entry is an object, mark it as referenced */
            val = &entry->val;
            if (val->typ == VM_OBJ)
                G_obj_table->mark_all_refs(val->val.obj, state);
        }
    }
}